

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Gia_Gen2CodeTest(void)

{
  uint uVar1;
  Vec_Int_t *vCode_00;
  time_t tVar2;
  Vec_Int_t *vCode;
  int nLutNum;
  int nLutSize;
  int i;
  
  vCode_00 = Vec_IntAlloc(4);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (nLutNum = 0; nLutNum < 4; nLutNum = nLutNum + 1) {
    uVar1 = rand();
    Vec_IntPush(vCode_00,uVar1 & 1);
  }
  Gia_Gen2CodePrint(1,2,vCode_00);
  Vec_IntFree(vCode_00);
  return;
}

Assistant:

void Gia_Gen2CodeTest()
{
    int i, nLutSize = 1, nLutNum = 2;
    Vec_Int_t * vCode = Vec_IntAlloc( (1 << nLutSize) * nLutNum );
    srand( time(NULL) );
    for ( i = 0; i < (1 << nLutSize) * nLutNum; i++ )
        Vec_IntPush( vCode, rand() & 1 );
    Gia_Gen2CodePrint( nLutSize, nLutNum, vCode );
    Vec_IntFree( vCode );
}